

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.cpp
# Opt level: O2

UBool __thiscall icu_63::Formattable::operator==(Formattable *this,Formattable *that)

{
  UBool UVar1;
  long lVar2;
  long lVar3;
  
  if (this == that) {
    return '\x01';
  }
  if (this->fType == that->fType) {
    switch(this->fType) {
    case kDate:
    case kDouble:
      return -((that->fValue).fDouble == (this->fValue).fDouble) & 1;
    case kLong:
    case kInt64:
      return (this->fValue).fObject == (that->fValue).fObject;
    case kString:
      UVar1 = UnicodeString::operator==((this->fValue).fString,(that->fValue).fString);
      return UVar1;
    case kArray:
      if ((this->fValue).fArrayAndCount.fCount == (that->fValue).fArrayAndCount.fCount) {
        lVar3 = -1;
        lVar2 = 0;
        do {
          lVar3 = lVar3 + 1;
          if ((this->fValue).fArrayAndCount.fCount <= lVar3) {
            return '\x01';
          }
          UVar1 = operator!=((Formattable *)((long)&((this->fValue).fObject)->_vptr_UObject + lVar2)
                             ,(Formattable *)
                              ((long)&((that->fValue).fObject)->_vptr_UObject + lVar2));
          lVar2 = lVar2 + 0x70;
        } while (UVar1 == '\0');
        return '\0';
      }
      break;
    case kObject:
      if (((Measure *)(this->fValue).fObject != (Measure *)0x0) &&
         ((that->fValue).fObject != (UObject *)0x0)) {
        UVar1 = Measure::operator==((Measure *)(this->fValue).fObject,(that->fValue).fObject);
        return UVar1;
      }
      break;
    default:
      return '\x01';
    }
  }
  return '\0';
}

Assistant:

UBool
Formattable::operator==(const Formattable& that) const
{
    int32_t i;

    if (this == &that) return TRUE;

    // Returns FALSE if the data types are different.
    if (fType != that.fType) return FALSE;

    // Compares the actual data values.
    UBool equal = TRUE;
    switch (fType) {
    case kDate:
        equal = (fValue.fDate == that.fValue.fDate);
        break;
    case kDouble:
        equal = (fValue.fDouble == that.fValue.fDouble);
        break;
    case kLong:
    case kInt64:
        equal = (fValue.fInt64 == that.fValue.fInt64);
        break;
    case kString:
        equal = (*(fValue.fString) == *(that.fValue.fString));
        break;
    case kArray:
        if (fValue.fArrayAndCount.fCount != that.fValue.fArrayAndCount.fCount) {
            equal = FALSE;
            break;
        }
        // Checks each element for equality.
        for (i=0; i<fValue.fArrayAndCount.fCount; ++i) {
            if (fValue.fArrayAndCount.fArray[i] != that.fValue.fArrayAndCount.fArray[i]) {
                equal = FALSE;
                break;
            }
        }
        break;
    case kObject:
        if (fValue.fObject == NULL || that.fValue.fObject == NULL) {
            equal = FALSE;
        } else {
            equal = objectEquals(fValue.fObject, that.fValue.fObject);
        }
        break;
    }

    // TODO:  compare digit lists if numeric.
    return equal;
}